

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrWorldMeshStateRequestCompletionML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  PFN_xrResultToString p_Var2;
  bool bVar3;
  XrInstance pXVar4;
  ostream *poVar5;
  invalid_argument *this;
  string futureresult_prefix;
  string type_prefix;
  string meshblockstates_prefix;
  string meshblockstatecountoutput_prefix;
  string meshblockstatecapacityinput_prefix;
  string timestamp_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  ostringstream oss_meshBlockStateCapacityInput;
  ostringstream oss_meshBlockStates;
  uint auStack_308 [88];
  ostringstream oss_meshBlockStateCountOutput;
  
  PointerToHexString<XrWorldMeshStateRequestCompletionML>
            ((XrWorldMeshStateRequestCompletionML *)futureresult_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_meshBlockStateCapacityInput);
  std::__cxx11::string::~string((string *)&oss_meshBlockStateCapacityInput);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_meshBlockStateCapacityInput,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_meshBlockStateCapacityInput);
    std::__cxx11::string::~string((string *)&oss_meshBlockStateCapacityInput);
  }
  else {
    _oss_meshBlockStateCapacityInput = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,(char *)&oss_meshBlockStateCapacityInput);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_meshBlockStateCapacityInput);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_4b8,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  std::__cxx11::string::~string((string *)&local_4b8);
  if (bVar3) {
    std::__cxx11::string::string((string *)&futureresult_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&futureresult_prefix);
    if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
      std::__cxx11::to_string((string *)&oss_meshBlockStateCapacityInput,value->futureResult);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&futureresult_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_meshBlockStateCapacityInput);
      std::__cxx11::string::~string((string *)&oss_meshBlockStateCapacityInput);
    }
    else {
      _oss_meshBlockStateCapacityInput = (pointer)0x0;
      p_Var2 = gen_dispatch_table->ResultToString;
      pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
      (*p_Var2)(pXVar4,value->futureResult,(char *)&oss_meshBlockStateCapacityInput);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[9],std::__cxx11::string&,char(&)[64]>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [9])"XrResult",&futureresult_prefix,
                 (char (*) [64])&oss_meshBlockStateCapacityInput);
    }
    std::__cxx11::string::string((string *)&timestamp_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&timestamp_prefix);
    std::__cxx11::to_string((string *)&oss_meshBlockStateCapacityInput,value->timestamp);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])"XrTime",&timestamp_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_meshBlockStateCapacityInput);
    std::__cxx11::string::~string((string *)&oss_meshBlockStateCapacityInput);
    std::__cxx11::string::string((string *)&meshblockstatecapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&meshblockstatecapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_meshBlockStateCapacityInput);
    poVar5 = std::operator<<((ostream *)&oss_meshBlockStateCapacityInput,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&meshblockstatecapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_meshBlockStateCountOutput);
    std::__cxx11::string::~string((string *)&oss_meshBlockStateCountOutput);
    std::__cxx11::string::string((string *)&meshblockstatecountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&meshblockstatecountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_meshBlockStateCountOutput);
    poVar5 = std::operator<<((ostream *)&oss_meshBlockStateCountOutput,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&meshblockstatecountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_meshBlockStates);
    std::__cxx11::string::~string((string *)&oss_meshBlockStates);
    std::__cxx11::string::string((string *)&meshblockstates_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&meshblockstates_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_meshBlockStates);
    *(uint *)((long)auStack_308 + *(long *)(_oss_meshBlockStates + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_meshBlockStates + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_meshBlockStates);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [25])0x2178b5,&meshblockstates_prefix,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_meshBlockStates);
    std::__cxx11::string::~string((string *)&meshblockstates_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_meshBlockStateCountOutput);
    std::__cxx11::string::~string((string *)&meshblockstatecountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_meshBlockStateCapacityInput);
    std::__cxx11::string::~string((string *)&meshblockstatecapacityinput_prefix);
    std::__cxx11::string::~string((string *)&timestamp_prefix);
    std::__cxx11::string::~string((string *)&futureresult_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrWorldMeshStateRequestCompletionML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string futureresult_prefix = prefix;
        futureresult_prefix += "futureResult";
        if (nullptr != gen_dispatch_table) {
            char futureResult_string[XR_MAX_RESULT_STRING_SIZE] = {};
            gen_dispatch_table->ResultToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                               value->futureResult, futureResult_string);
            contents.emplace_back("XrResult", futureresult_prefix, futureResult_string);
        } else {
                        contents.emplace_back("XrResult", futureresult_prefix, std::to_string(value->futureResult));
        }
        std::string timestamp_prefix = prefix;
        timestamp_prefix += "timestamp";
        contents.emplace_back("XrTime", timestamp_prefix, std::to_string(value->timestamp));
        std::string meshblockstatecapacityinput_prefix = prefix;
        meshblockstatecapacityinput_prefix += "meshBlockStateCapacityInput";
        std::ostringstream oss_meshBlockStateCapacityInput;
        oss_meshBlockStateCapacityInput << "0x" << std::hex << (value->meshBlockStateCapacityInput);
        contents.emplace_back("uint32_t", meshblockstatecapacityinput_prefix, oss_meshBlockStateCapacityInput.str());
        std::string meshblockstatecountoutput_prefix = prefix;
        meshblockstatecountoutput_prefix += "meshBlockStateCountOutput";
        std::ostringstream oss_meshBlockStateCountOutput;
        oss_meshBlockStateCountOutput << "0x" << std::hex << (value->meshBlockStateCountOutput);
        contents.emplace_back("uint32_t", meshblockstatecountoutput_prefix, oss_meshBlockStateCountOutput.str());
        std::string meshblockstates_prefix = prefix;
        meshblockstates_prefix += "meshBlockStates";
        std::ostringstream oss_meshBlockStates;
        oss_meshBlockStates << std::hex << reinterpret_cast<const void*>(value->meshBlockStates);
        contents.emplace_back("XrWorldMeshBlockStateML*", meshblockstates_prefix, oss_meshBlockStates.str());
        return true;
    } catch(...) {
    }
    return false;
}